

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<tinyusdz::Path> *value)

{
  bool bVar1;
  undefined1 local_f8 [8];
  Path v;
  optional<tinyusdz::Path> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::Path>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    Path::Path((Path *)local_f8);
    this_local._7_1_ = ReadBasicType(this,(Path *)local_f8);
    if (this_local._7_1_) {
      nonstd::optional_lite::optional<tinyusdz::Path>::operator=(value,(Path *)local_f8);
    }
    Path::~Path((Path *)local_f8);
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<Path> *value) {

  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  Path v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}